

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::convert_number_to_mantissa_exponent
               (double value,char (*buffer) [32],char **out_mantissa,int *out_exponent)

{
  int iVar1;
  char *end;
  int *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  undefined8 in_XMM0_Qa;
  char *mantissa;
  int exponent;
  char *exponent_string;
  char *local_40;
  
  snprintf(in_RDI,0x20,"%.*e",in_XMM0_Qa,0xf);
  end = strchr(in_RDI,0x65);
  iVar1 = atoi(end + 1);
  local_40 = in_RDI;
  if (*in_RDI == '-') {
    local_40 = in_RDI + 1;
  }
  local_40[1] = *local_40;
  truncate_zeros(local_40 + 1,end);
  *in_RSI = local_40 + 1;
  *in_RDX = iVar1 + 1;
  return;
}

Assistant:

PUGI__FN void convert_number_to_mantissa_exponent(double value, char (&buffer)[32], char** out_mantissa, int* out_exponent)
	{
		// get a scientific notation value with IEEE DBL_DIG decimals
		PUGI__SNPRINTF(buffer, "%.*e", DBL_DIG, value);

		// get the exponent (possibly negative)
		char* exponent_string = strchr(buffer, 'e');
		assert(exponent_string);

		int exponent = atoi(exponent_string + 1);

		// extract mantissa string: skip sign
		char* mantissa = buffer[0] == '-' ? buffer + 1 : buffer;
		assert(mantissa[0] != '0' && mantissa[1] == '.');

		// divide mantissa by 10 to eliminate integer part
		mantissa[1] = mantissa[0];
		mantissa++;
		exponent++;

		// remove extra mantissa digits and zero-terminate mantissa
		truncate_zeros(mantissa, exponent_string);

		// fill results
		*out_mantissa = mantissa;
		*out_exponent = exponent;
	}